

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O2

Result __thiscall
testing::internal::FunctionMockerBase<void_(unsigned_short,_unsigned_short)>::InvokeWith
          (FunctionMockerBase<void_(unsigned_short,_unsigned_short)> *this,type args)

{
  UntypedActionResultHolderBase *f;
  scoped_ptr<testing::internal::ActionResultHolder<void>_> holder;
  scoped_ptr<testing::internal::ActionResultHolder<void>_> local_8;
  
  f = UntypedFunctionMockerBase::UntypedInvokeWith(&this->super_UntypedFunctionMockerBase,args);
  local_8.ptr_ = DownCast_<testing::internal::ActionResultHolder<void>*,testing::internal::UntypedActionResultHolderBase>
                           (f);
  scoped_ptr<testing::internal::ActionResultHolder<void>_>::~scoped_ptr(&local_8);
  return;
}

Assistant:

GTEST_LOCK_EXCLUDED_(g_gmock_mutex) {
    // const_cast is required since in C++98 we still pass ArgumentTuple around
    // by const& instead of rvalue reference.
    void* untyped_args = const_cast<void*>(static_cast<const void*>(&args));
    scoped_ptr<ResultHolder> holder(
        DownCast_<ResultHolder*>(this->UntypedInvokeWith(untyped_args)));
    return holder->Unwrap();
  }